

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Collision *collision)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"crash: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," O: ");
  poVar1 = operator<<(poVar1,&collision->P);
  poVar1 = std::operator<<(poVar1," N: ");
  poVar1 = operator<<(poVar1,&collision->N);
  std::operator<<(poVar1," dist: ");
  poVar1 = std::ostream::_M_insert<double>(collision->dist);
  poVar1 = std::operator<<(poVar1," primitive: ");
  std::ostream::_M_insert<void_const*>(poVar1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Collision &collision) {
    os << "crash: " << collision.crash << " O: " << collision.P << " N: " << collision.N << " dist: " << collision.dist
       << " primitive: " << collision.primitive;
    return os;
}